

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesarray.hpp
# Opt level: O2

void __thiscall
bal::VariablesArray::assign_element
          (VariablesArray *this,literalid_t *src,variableid_t src_size,variableid_t index)

{
  uint __line;
  char *__assertion;
  
  if (this->element_size_ == src_size) {
    if ((index + 1) * src_size <= (this->super_Container<unsigned_int>).size_) {
      if (src_size != 0) {
        memmove((this->super_Container<unsigned_int>).data_ + index * src_size,src,
                (ulong)src_size << 2);
        return;
      }
      return;
    }
    __assertion = "(index + 1) * element_size_ <= size_";
    __line = 0x6e;
  }
  else {
    __assertion = "src_size == element_size_";
    __line = 0x6d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesarray.hpp"
                ,__line,
                "void bal::VariablesArray::assign_element(const literalid_t *const, const variableid_t, const variableid_t)"
               );
}

Assistant:

void assign_element(const literalid_t* const src, const variableid_t src_size, const variableid_t index) {
            assert(src_size == element_size_);
            assert((index + 1) * element_size_ <= size_);
            std::copy(src, src + src_size, data_ + (index * element_size_));
        }